

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall duckdb_re2::BitState::ShouldVisit(BitState *this,int id,char *p)

{
  unsigned_long *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = ((int)p - *(int *)&(this->text_).data_) +
          ((int)(this->text_).size_ + 1) *
          (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                ((long)&(this->prog_->list_heads_).ptr_._M_t.
                        super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>
                + 8))->_M_head_impl[id];
  puVar1 = (this->visited_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  uVar2 = puVar1[(int)uVar3 / 0x40];
  uVar4 = 1L << ((byte)uVar3 & 0x3f);
  if ((uVar2 >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
    puVar1[(int)uVar3 / 0x40] = uVar4 | uVar2;
  }
  return (uVar4 & uVar2) == 0;
}

Assistant:

bool BitState::ShouldVisit(int id, const char* p) {
  int n = prog_->list_heads()[id] * static_cast<int>(text_.size()+1) +
          static_cast<int>(p-text_.data());
  if (visited_[n/kVisitedBits] & (uint64_t{1} << (n & (kVisitedBits-1))))
    return false;
  visited_[n/kVisitedBits] |= uint64_t{1} << (n & (kVisitedBits-1));
  return true;
}